

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.c
# Opt level: O0

Value * apply_exponent_operation(Value *left_value,Value *right_value)

{
  double __x;
  double dVar1;
  double dVar2;
  longdouble result;
  longdouble right_float;
  longdouble left_float;
  Value *right_value_local;
  Value *left_value_local;
  
  if (((left_value->value_type == ValueTypeIntegerValue) ||
      (left_value->value_type == ValueTypeFloatValue)) &&
     ((right_value->value_type == ValueTypeIntegerValue ||
      (right_value->value_type == ValueTypeFloatValue)))) {
    if (left_value->value_type == ValueTypeFloatValue) {
      unique0x00006f00 = *(longdouble *)&left_value[1].linked_variable_count;
    }
    else {
      register0x00001100 = (longdouble)*(long *)(left_value + 1);
    }
    if (right_value->value_type == ValueTypeFloatValue) {
      unique0x00006f00 = *(longdouble *)&right_value[1].linked_variable_count;
    }
    else {
      register0x00001100 = (longdouble)*(long *)(right_value + 1);
    }
    __x = pow((double)stack0xffffffffffffffc8,(double)stack0xffffffffffffffb8);
    dVar1 = ceil(__x);
    dVar2 = floor(__x);
    if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
      left_value_local = new_float_value((longdouble)__x);
    }
    else {
      left_value_local = new_integer_value((long)ROUND((longdouble)__x));
    }
  }
  else {
    left_value_local = new_null_value();
  }
  return left_value_local;
}

Assistant:

Value *apply_exponent_operation(Value *left_value, Value *right_value) {
  if ((left_value->value_type == ValueTypeIntegerValue || left_value->value_type == ValueTypeFloatValue) && (right_value->value_type == ValueTypeIntegerValue || right_value->value_type == ValueTypeFloatValue)) {
    long double left_float, right_float, result;

    if (left_value->value_type == ValueTypeFloatValue) left_float = ((FloatValue *) left_value)->float_value;
    else left_float = ((IntegerValue *) left_value)->integer_value;

    if (right_value->value_type == ValueTypeFloatValue) right_float = ((FloatValue *) right_value)->float_value;
    else right_float = ((IntegerValue *) right_value)->integer_value;

    result = pow(left_float, right_float);

    if (ceil(result) == floor(result)) {
      return new_integer_value((long long int) result);
    }
    else {
      return new_float_value(result);
    }
  }

  return new_null_value();
}